

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcShow.c
# Opt level: O3

void Abc_NodeShowBddOne(DdManager *dd,DdNode *bFunc)

{
  FILE *__stream;
  DdNode *local_18;
  
  local_18 = bFunc;
  __stream = fopen("temp.dot","w");
  if (__stream != (FILE *)0x0) {
    Cudd_DumpDot(dd,1,&local_18,(char **)0x0,(char **)0x0,(FILE *)__stream);
    fclose(__stream);
    Abc_ShowFile("temp.dot");
    return;
  }
  fprintf(_stdout,"Cannot open the intermediate file \"%s\".\n","temp.dot");
  return;
}

Assistant:

void Abc_NodeShowBddOne( DdManager * dd, DdNode * bFunc )
{
    char * FileNameDot = "temp.dot";
    FILE * pFile;
    if ( (pFile = fopen( FileNameDot, "w" )) == NULL )
    {
        fprintf( stdout, "Cannot open the intermediate file \"%s\".\n", FileNameDot );
        return;
    }
    Cudd_DumpDot( dd, 1, (DdNode **)&bFunc, NULL, NULL, pFile );
    fclose( pFile );
    Abc_ShowFile( FileNameDot );
}